

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O1

pair<double,_double>
Function_Template::template_BitwiseOr(BitwiseOrForm2 BitwiseOr,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer timer;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_58;
  TimerContainer local_40;
  
  Test_Helper::uniformImages(&local_58,3,size,size);
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&local_40);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start(&local_40);
    (*BitwiseOr)(local_58.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_58.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 local_58.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2);
    Performance_Test::TimerContainer::stop(&local_40);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean(&local_40.super_BaseTimerContainer);
  Performance_Test::TimerContainer::~TimerContainer(&local_40);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_58);
  return pVar3;
}

Assistant:

std::pair < double, double > template_BitwiseOr( BitwiseOrForm2 BitwiseOr, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 3, size, size );

        TEST_FUNCTION_LOOP( BitwiseOr( image[0], image[1], image[2] ), namespaceName )
    }